

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

xml_attribute __thiscall
pugi::xml_node::insert_attribute_before(xml_node *this,char_t *name_,xml_attribute *attr)

{
  ulong uVar1;
  xml_node_struct *pxVar2;
  xml_allocator *this_00;
  xml_attribute_struct *pxVar3;
  xml_attribute_struct *pxVar4;
  xml_attribute_struct *pxVar5;
  uint uVar6;
  xml_attribute_struct **ppxVar7;
  xml_attribute a;
  xml_attribute local_20;
  
  pxVar2 = this->_root;
  if (pxVar2 == (xml_node_struct *)0x0) {
    uVar6 = 0;
  }
  else {
    uVar6 = (uint)pxVar2->header & 0xf;
  }
  if (((uVar6 == 7) || (uVar6 == 2)) && (attr->_attr != (xml_attribute_struct *)0x0)) {
    ppxVar7 = &pxVar2->first_attribute;
    do {
      pxVar5 = *ppxVar7;
      if (pxVar5 == attr->_attr) break;
      ppxVar7 = &pxVar5->next_attribute;
    } while (pxVar5 != (xml_attribute_struct *)0x0);
    if (pxVar5 != (xml_attribute_struct *)0x0) {
      if (pxVar2 == (xml_node_struct *)0x0) {
        __assert_fail("object",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                      ,0x486,
                      "xml_allocator &pugi::impl::(anonymous namespace)::get_allocator(const Object *) [Object = pugi::xml_node_struct]"
                     );
      }
      this_00 = *(xml_allocator **)((long)pxVar2 - (pxVar2->header >> 8));
      uVar1 = this_00->_busy_size + 0x28;
      if (uVar1 < 0x7fd9) {
        local_20._attr = (xml_attribute_struct *)this_00->_root;
        pxVar5 = (xml_attribute_struct *)
                 ((long)&((xml_memory_page *)local_20._attr)[1].allocator + this_00->_busy_size);
        this_00->_busy_size = uVar1;
      }
      else {
        pxVar5 = (xml_attribute_struct *)
                 impl::anon_unknown_0::xml_allocator::allocate_memory_oob
                           (this_00,0x28,(xml_memory_page **)&local_20);
      }
      if (pxVar5 == (xml_attribute_struct *)0x0) {
        pxVar5 = (xml_attribute_struct *)0x0;
      }
      else {
        pxVar5->name = (char_t *)0x0;
        pxVar5->value = (char_t *)0x0;
        pxVar5->prev_attribute_c = (xml_attribute_struct *)0x0;
        pxVar5->next_attribute = (xml_attribute_struct *)0x0;
        pxVar5->header = ((long)pxVar5 - (long)local_20._attr) * 0x100;
      }
      if (pxVar5 != (xml_attribute_struct *)0x0) {
        pxVar3 = attr->_attr;
        pxVar4 = pxVar3->prev_attribute_c;
        ppxVar7 = &this->_root->first_attribute;
        if (pxVar4->next_attribute != (xml_attribute_struct *)0x0) {
          ppxVar7 = &pxVar4->next_attribute;
        }
        *ppxVar7 = pxVar5;
        pxVar5->prev_attribute_c = pxVar4;
        pxVar5->next_attribute = pxVar3;
        pxVar3->prev_attribute_c = pxVar5;
        local_20._attr = pxVar5;
        xml_attribute::set_name(&local_20,name_);
        return (xml_attribute)local_20._attr;
      }
    }
  }
  return (xml_attribute)(xml_attribute_struct *)0x0;
}

Assistant:

PUGI__FN xml_attribute xml_node::insert_attribute_before(const char_t* name_, const xml_attribute& attr)
	{
		if (!impl::allow_insert_attribute(type())) return xml_attribute();
		if (!attr || !impl::is_attribute_of(attr._attr, _root)) return xml_attribute();

		impl::xml_allocator& alloc = impl::get_allocator(_root);
		if (!alloc.reserve()) return xml_attribute();

		xml_attribute a(impl::allocate_attribute(alloc));
		if (!a) return xml_attribute();

		impl::insert_attribute_before(a._attr, attr._attr, _root);

		a.set_name(name_);

		return a;
	}